

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.cpp
# Opt level: O2

void duckdb::StrpTimeFunction::Parse<duckdb::timestamp_ns_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  idx_t count;
  BoundFunctionExpression *pBVar1;
  anon_class_8_1_898d11ac fun;
  reference pvVar2;
  UnifiedVectorFormat format_unified;
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  fun.info = (StrpTimeBindData *)
             unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar1->bind_info);
  count = args->count;
  UnifiedVectorFormat::UnifiedVectorFormat(&format_unified);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  Vector::ToUnifiedFormat(pvVar2,count,&format_unified);
  if ((format_unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
       (unsigned_long *)0x0) ||
     ((*format_unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask & 1) != 0))
  {
    pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    UnaryExecutor::
    Execute<duckdb::string_t,duckdb::timestamp_ns_t,duckdb::StrpTimeFunction::Parse<duckdb::timestamp_ns_t>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_>
              (pvVar2,result,args->count,fun,CAN_THROW_RUNTIME_ERROR);
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&format_unified);
  return;
}

Assistant:

static void Parse(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<StrpTimeBindData>();

		//	There is a bizarre situation where the format column is foldable but not constant
		//	(i.e., the statistics tell us it has only one value)
		//	We have to check whether that value is NULL
		const auto count = args.size();
		UnifiedVectorFormat format_unified;
		args.data[1].ToUnifiedFormat(count, format_unified);

		if (!format_unified.validity.RowIsValid(0)) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}
		UnaryExecutor::Execute<string_t, T>(args.data[0], result, args.size(), [&](string_t input) {
			StrpTimeFormat::ParseResult result;
			for (auto &format : info.formats) {
				if (format.Parse(input, result)) {
					return StrpTimeResult<T>(result);
				}
			}
			throw InvalidInputException(result.FormatError(input, info.formats[0].format_specifier));
		});
	}